

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteProjectLine
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmGeneratorTarget *target,
          string *rootBinaryDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmValue remote;
  cmValue cVar2;
  ostream *poVar3;
  string path;
  char local_51;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GENERATOR_FILE_NAME","");
  remote = cmGeneratorTarget::GetProperty(target,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GENERATOR_FILE_NAME_EXT","");
  cVar2 = cmGeneratorTarget::GetProperty(target,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (cVar2.Value != (string *)0x0 && remote.Value != (string *)0x0) {
    cmSystemTools::RelativePath(&local_50,rootBinaryDir,remote.Value);
    std::__ostream_insert<char,std::char_traits<char>>
              (fout,local_50._M_dataplus._M_p,local_50._M_string_length);
    local_51 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(fout,&local_51,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,((cVar2.Value)->_M_dataplus)._M_p,(cVar2.Value)->_M_string_length);
    local_51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_51,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteProjectLine(
  std::ostream& fout, cmGeneratorTarget const* target,
  std::string& rootBinaryDir)
{
  cmValue projFile = target->GetProperty("GENERATOR_FILE_NAME");
  cmValue projType = target->GetProperty("GENERATOR_FILE_NAME_EXT");
  /* If either value is not valid then this particular target is an
   * unsupported target type and should be skipped.
   */
  if (projFile && projType) {
    std::string path = cmSystemTools::RelativePath(rootBinaryDir, *projFile);

    fout << path;
    fout << ' ' << *projType << '\n';
  }
}